

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_parse_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *json;
  char *pcVar8;
  
  pcVar2 = uo_json_find_end(" {}");
  pcVar3 = uo_json_find_end("[]");
  pcVar4 = uo_json_find_end("\"\"");
  pcVar5 = uo_json_find_end("  { ");
  pcVar6 = uo_json_find_end(
                           " { \"test\": [], \"asdf\": -123.123e+123,  \"qwer\": {     \"zxcv\": null,      \"asdf\": \"\\\"\"   }  } "
                           );
  pcVar7 = uo_json_find_value(" { \"test\": [], \"asdf\": -123.123e+123,  \"qwer\": {     \"zxcv\": null,      \"asdf\": \"\\\"\"   }  } "
                              ,"asdf");
  json = uo_json_find_value("{ \"sub\": \"1234567890\",\"name\": \"John Doe\",\"iat\": 1516239022}",
                            "sub");
  pcVar8 = uo_json_find_end(json);
  iVar1 = bcmp(json,"\"1234567890\"",(long)pcVar8 - (long)json);
  return (int)(iVar1 != 0 ||
              (pcVar7 != 
               "-123.123e+123,  \"qwer\": {     \"zxcv\": null,      \"asdf\": \"\\\"\"   }  } " ||
              (pcVar6 != " " ||
              ((pcVar5 != (char *)0x0 || pcVar4 != "") || (pcVar3 != "" || pcVar2 != "")))));
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    const char *json1 = " {}";
    passed &= uo_json_find_end(json1) - json1 == 3;

    const char *json2 = "[]";
    passed &= uo_json_find_end(json2) - json2 == 2; 

    const char *json3 = "\"\"";
    passed &= uo_json_find_end(json3) - json3 == 2; 

    const char *json4 = "  { ";
    passed &= uo_json_find_end(json4) == NULL;

    const char *json5 =
        " {"
        " \"test\": [],"
        " \"asdf\": -123.123e+123, "
        " \"qwer\": {"
        "     \"zxcv\": null, "
        "     \"asdf\": \"\\\"\""
        "   } "
        " } ";
    passed &= uo_json_find_end(json5) - json5 == 91;
    passed &= uo_json_find_value(json5, "asdf") - json5 == 23;

    const char *json6 =
     "{ "
        "\"sub\": \"1234567890\","
        "\"name\": \"John Doe\","
        "\"iat\": 1516239022"
    "}";

    char *val6 = uo_json_find_value(json6, "sub");
    size_t val6_len = uo_json_find_end(val6) - val6;

    passed &= memcmp(val6, "\"1234567890\"", val6_len) == 0;

    return passed ? 0 : 1;
}